

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_FACopyDescriptor.H
# Opt level: O0

void __thiscall
amrex::FabArrayCopyDescriptor<amrex::FArrayBox>::FillFab
          (FabArrayCopyDescriptor<amrex::FArrayBox> *this,FabArrayId faid,FillBoxId *fillboxid,
          FArrayBox *destFab)

{
  bool bVar1;
  int iVar2;
  FillBoxId *in_RDX;
  long in_RDI;
  FabCopyDescriptor<amrex::FArrayBox> *fcdp;
  FCDMapIter fmi;
  pair<std::_Rb_tree_iterator<std::pair<const_int,_amrex::FabCopyDescriptor<amrex::FArrayBox>_*>_>,_std::_Rb_tree_iterator<std::pair<const_int,_amrex::FabCopyDescriptor<amrex::FArrayBox>_*>_>_>
  match;
  int in_stack_00000114;
  Box *in_stack_00000118;
  int in_stack_00000124;
  Box *in_stack_00000128;
  BaseFab<double> *in_stack_00000130;
  BaseFab<double> *in_stack_00000138;
  int in_stack_000003e0;
  undefined4 in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff7c;
  multimap<int,_amrex::FabCopyDescriptor<amrex::FArrayBox>_*,_std::less<int>,_std::allocator<std::pair<const_int,_amrex::FabCopyDescriptor<amrex::FArrayBox>_*>_>_>
  *in_stack_ffffffffffffff80;
  _Self local_40;
  int local_34;
  pair<std::_Rb_tree_iterator<std::pair<const_int,_amrex::FabCopyDescriptor<amrex::FArrayBox>_*>_>,_std::_Rb_tree_iterator<std::pair<const_int,_amrex::FabCopyDescriptor<amrex::FArrayBox>_*>_>_>
  local_30;
  FillBoxId *local_18;
  FabArrayId local_4;
  
  local_18 = in_RDX;
  iVar2 = FabArrayId::Id(&local_4);
  std::
  vector<std::multimap<int,_amrex::FabCopyDescriptor<amrex::FArrayBox>_*,_std::less<int>,_std::allocator<std::pair<const_int,_amrex::FabCopyDescriptor<amrex::FArrayBox>_*>_>_>,_std::allocator<std::multimap<int,_amrex::FabCopyDescriptor<amrex::FArrayBox>_*,_std::less<int>,_std::allocator<std::pair<const_int,_amrex::FabCopyDescriptor<amrex::FArrayBox>_*>_>_>_>_>
  ::operator[]((vector<std::multimap<int,_amrex::FabCopyDescriptor<amrex::FArrayBox>_*,_std::less<int>,_std::allocator<std::pair<const_int,_amrex::FabCopyDescriptor<amrex::FArrayBox>_*>_>_>,_std::allocator<std::multimap<int,_amrex::FabCopyDescriptor<amrex::FArrayBox>_*,_std::less<int>,_std::allocator<std::pair<const_int,_amrex::FabCopyDescriptor<amrex::FArrayBox>_*>_>_>_>_>
                *)(in_RDI + 0x18),(long)iVar2);
  local_34 = FillBoxId::Id(local_18);
  local_30 = std::
             multimap<int,_amrex::FabCopyDescriptor<amrex::FArrayBox>_*,_std::less<int>,_std::allocator<std::pair<const_int,_amrex::FabCopyDescriptor<amrex::FArrayBox>_*>_>_>
             ::equal_range(in_stack_ffffffffffffff80,
                           (key_type *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78)
                          );
  local_40._M_node = local_30.first._M_node;
  while (bVar1 = std::operator!=(&local_40,&local_30.second), bVar1) {
    std::_Rb_tree_iterator<std::pair<const_int,_amrex::FabCopyDescriptor<amrex::FArrayBox>_*>_>::
    operator*((_Rb_tree_iterator<std::pair<const_int,_amrex::FabCopyDescriptor<amrex::FArrayBox>_*>_>
               *)0x5b3bc1);
    BaseFab<double>::copy<(amrex::RunOn)1>
              (in_stack_00000138,in_stack_00000130,in_stack_00000128,in_stack_00000124,
               in_stack_00000118,in_stack_00000114,in_stack_000003e0);
    std::_Rb_tree_iterator<std::pair<const_int,_amrex::FabCopyDescriptor<amrex::FArrayBox>_*>_>::
    operator++((_Rb_tree_iterator<std::pair<const_int,_amrex::FabCopyDescriptor<amrex::FArrayBox>_*>_>
                *)in_stack_ffffffffffffff80);
  }
  return;
}

Assistant:

void
FabArrayCopyDescriptor<FAB>::FillFab (FabArrayId       faid,
                                      const FillBoxId& fillboxid,
                                      FAB&             destFab)
{
    BL_ASSERT(dataAvailable);

    std::pair<FCDMapIter,FCDMapIter> match = fabCopyDescList[faid.Id()].equal_range(fillboxid.Id());

    for (FCDMapIter fmi = match.first; fmi != match.second; ++fmi)
    {
        FabCopyDescriptor<FAB>* fcdp = (*fmi).second;

        BL_ASSERT(fcdp->fillBoxId == fillboxid.Id());

        destFab.template copy<RunOn::Host>
                   (*fcdp->localFabSource,
                     fcdp->subBox,
                     fcdp->fillType == FillLocally ? fcdp->srcComp : 0,
                     fcdp->subBox,
                     fcdp->destComp,
                     fcdp->nComp);
    }
}